

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O3

DdNode * Cudd_zddIte(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddIte(dd,f,g,h);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_zddIte(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddZddIte(dd, f, g, h);
    } while (dd->reordered == 1);
    return(res);

}